

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O3

void __thiscall
shaping_clipper::clip_to_window
          (shaping_clipper *this,float *windowed_frame,float *clipping_delta,float delta_boost)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  
  iVar1 = this->oversample;
  uVar4 = this->size * iVar1;
  if (0 < (int)uVar4) {
    iVar2 = this->max_oversample;
    pfVar3 = (this->window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      fVar6 = this->clip_level * *pfVar3;
      fVar7 = windowed_frame[uVar5] + clipping_delta[uVar5];
      if ((fVar6 < fVar7) || (fVar6 = -fVar6, fVar7 < fVar6)) {
        clipping_delta[uVar5] = (fVar6 - fVar7) * delta_boost + clipping_delta[uVar5];
      }
      uVar5 = uVar5 + 1;
      pfVar3 = pfVar3 + iVar2 / iVar1;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void shaping_clipper::clip_to_window(const float* windowed_frame, float* clipping_delta, float delta_boost) {
    const float* window = this->window.data();
    int total_samples = this->size * this->oversample;
    int window_stride = this->max_oversample / this->oversample;
    for (int i = 0; i < total_samples; i++) {
        float limit = this->clip_level * *window;
        float effective_value = windowed_frame[i] + clipping_delta[i];
        if (effective_value > limit) {
            clipping_delta[i] += (limit - effective_value) * delta_boost;
        } else if (effective_value < -limit) {
            clipping_delta[i] += (-limit - effective_value) * delta_boost;
        }
        window += window_stride;
    }
}